

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Label * __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetLabel(BinaryReaderInterp *this,Index depth)

{
  pointer pLVar1;
  long lVar2;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->label_stack_).
                super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
  if ((ulong)depth < (ulong)(lVar2 >> 4)) {
    return (Label *)((long)pLVar1 + ~(ulong)depth * 0x10 + lVar2);
  }
  __assert_fail("depth < label_stack_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                ,0x186,
                "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)");
}

Assistant:

Label* BinaryReaderInterp::GetLabel(Index depth) {
  assert(depth < label_stack_.size());
  return &label_stack_[label_stack_.size() - depth - 1];
}